

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_eval_simd.h
# Opt level: O3

void __thiscall
embree::sse2::
PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
::PatchEvalSimd(PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
                *this,CacheEntry *entry,size_t commitCounter,HalfEdge *edge,char *vertices,
               size_t stride,vboolf_impl<4> *valid0,vfloat_impl<4> *u,vfloat_impl<4> *v,float *P,
               float *dPdu,float *dPdv,float *ddPdudu,float *ddPdvdv,float *ddPdudv,size_t dstride,
               size_t N)

{
  long lVar1;
  undefined1 auVar2 [16];
  long lVar3;
  int iVar4;
  long *plVar5;
  long *plVar6;
  Ref u_00;
  long lVar7;
  sse2 *this_00;
  ulong uVar8;
  bool bVar9;
  vboolf_impl<4> valid1;
  vboolf_impl<4> valid2;
  FeatureAdaptiveEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
  local_70;
  
  this->P = P;
  this->dPdu = dPdu;
  this->dPdv = dPdv;
  this->ddPdudu = ddPdudu;
  this->ddPdvdv = ddPdvdv;
  this->ddPdudv = ddPdudv;
  this->dstride = dstride;
  this->N = N;
  lVar3 = DAT_021b94c0;
  plVar5 = (long *)__tls_get_addr(&PTR_021a7140);
  this_00 = (sse2 *)*plVar5;
  if (this_00 == (sse2 *)0x0) {
    SharedLazyTessellationCache::getNextRenderThreadWorkState
              ((SharedLazyTessellationCache *)
               &SharedLazyTessellationCache::sharedLazyTessellationCache);
    this_00 = (sse2 *)*plVar5;
  }
  lVar7 = commitCounter * 8;
  do {
    LOCK();
    uVar8 = *(ulong *)this_00;
    *(long *)this_00 = *(long *)this_00 + 1;
    UNLOCK();
    if (3 < uVar8) {
      sse2::PatchEvalSimd(this_00);
    }
    uVar8 = (entry->tag).data.super_atomic<long>.super___atomic_base<long>._M_i;
    if ((uVar8 != 0) &&
       (u_00.ptr = (uVar8 & 0xffffffffff) + SharedLazyTessellationCache::sharedLazyTessellationCache
       , (vfloat_impl<4> *)u_00.ptr != (vfloat_impl<4> *)0x0 &&
         (ulong)(DAT_021b94c0 + lVar7) <= ((long)uVar8 >> 0x28) + 7U)) goto LAB_00d4e0ac;
    if (((entry->mutex).flag.super_atomic<bool>._M_base._M_i & 1U) == 0) {
      LOCK();
      bVar9 = (entry->mutex).flag.super_atomic<bool>._M_base._M_i == false;
      if (bVar9) {
        (entry->mutex).flag.super_atomic<bool>._M_base._M_i = true;
      }
      UNLOCK();
      if (bVar9) {
        lVar1 = (entry->tag).data.super_atomic<long>.super___atomic_base<long>._M_i;
        if ((lVar1 == 0) || ((lVar1 >> 0x28) + 7U < (ulong)(DAT_021b94c0 + lVar7))) {
          iVar4 = (int)DAT_021b94c0;
          u_00 = PatchT<embree::vfloat_impl<4>,embree::vfloat_impl<4>>::operator()
                           ((anon_class_1_0_00000001 *)&valid1,edge,vertices,stride);
          uVar8 = (ulong)(uint)(iVar4 + (int)lVar7) << 0x28 |
                  u_00.ptr - SharedLazyTessellationCache::sharedLazyTessellationCache;
          if (u_00.ptr == 0) {
            uVar8 = 0;
          }
          LOCK();
          (entry->tag).data.super_atomic<long>.super___atomic_base<long>._M_i = uVar8;
          UNLOCK();
          (entry->mutex).flag.super_atomic<bool>._M_base._M_i = false;
LAB_00d4e0ac:
          if ((lVar3 + lVar7 + 7U < (ulong)(DAT_021b94c0 + lVar7)) ||
             ((vfloat_impl<4> *)u_00.ptr == (vfloat_impl<4> *)0x0)) {
            valid1.field_0._0_8_ = mm_lookupmask_ps._0_8_;
            valid1.field_0._8_8_ = mm_lookupmask_ps._8_8_;
          }
          else {
            eval((PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
                  *)&valid1,(vboolf_impl<4> *)this,(Ref)valid0,(vfloat_impl<4> *)u_00.ptr,u,1.0,
                 (size_t)v);
          }
          plVar6 = (long *)*plVar5;
          if (plVar6 == (long *)0x0) {
            SharedLazyTessellationCache::getNextRenderThreadWorkState
                      ((SharedLazyTessellationCache *)
                       &SharedLazyTessellationCache::sharedLazyTessellationCache);
            plVar6 = (long *)*plVar5;
          }
          LOCK();
          *plVar6 = *plVar6 + -1;
          UNLOCK();
          valid2.field_0.i[0] = ~valid1.field_0.i[0] & (valid0->field_0).i[0];
          valid2.field_0.i[1] = ~valid1.field_0.i[1] & (valid0->field_0).i[1];
          valid2.field_0.i[2] = ~valid1.field_0.i[2] & (valid0->field_0).i[2];
          valid2.field_0.i[3] = ~valid1.field_0.i[3] & (valid0->field_0).i[3];
          auVar2._4_4_ = valid2.field_0.i[1];
          auVar2._0_4_ = valid2.field_0.i[0];
          auVar2._8_4_ = valid2.field_0.i[2];
          auVar2._12_4_ = valid2.field_0.i[3];
          iVar4 = movmskps((int)plVar6,auVar2);
          if (iVar4 != 0) {
            FeatureAdaptiveEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
            ::FeatureAdaptiveEvalSimd
                      (&local_70,edge,vertices,stride,&valid2,u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,
                       ddPdudv,dstride,N);
          }
          return;
        }
        (entry->mutex).flag.super_atomic<bool>._M_base._M_i = false;
      }
    }
    LOCK();
    *(long *)this_00 = *(long *)this_00 + -1;
    UNLOCK();
  } while( true );
}

Assistant:

PatchEvalSimd (SharedLazyTessellationCache::CacheEntry& entry, size_t commitCounter, 
                       const HalfEdge* edge, const char* vertices, size_t stride, const vbool& valid0, const vfloat& u, const vfloat& v, 
                       float* P, float* dPdu, float* dPdv, float* ddPdudu, float* ddPdvdv, float* ddPdudv, const size_t dstride, const size_t N)
        : P(P), dPdu(dPdu), dPdv(dPdv), ddPdudu(ddPdudu), ddPdvdv(ddPdvdv), ddPdudv(ddPdudv), dstride(dstride), N(N)
        {
          /* conservative time for the very first allocation */
          auto time = SharedLazyTessellationCache::sharedLazyTessellationCache.getTime(commitCounter);

          Ref patch = SharedLazyTessellationCache::lookup(entry,commitCounter,[&] () {
              auto alloc = [](size_t bytes) { return SharedLazyTessellationCache::malloc(bytes); };
              return Patch::create(alloc,edge,vertices,stride);
            }, true);

          auto curTime = SharedLazyTessellationCache::sharedLazyTessellationCache.getTime(commitCounter);
          const bool allAllocationsValid = SharedLazyTessellationCache::validTime(time,curTime);
          
          patch = allAllocationsValid ? patch : nullptr;

          /* use cached data structure for calculations */
          const vbool valid1 = patch ? eval(valid0,patch,u,v,1.0f,0) : vbool(false);
          SharedLazyTessellationCache::unlock();
          const vbool valid2 = valid0 & !valid1;
          if (any(valid2)) {
            FeatureAdaptiveEvalSimd<vbool,vint,vfloat,Vertex,Vertex_t>(edge,vertices,stride,valid2,u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dstride,N);
          }
        }